

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void XML_ParserFree(XML_Parser parser)

{
  tag *ptVar1;
  binding *pbVar2;
  DTD *table;
  XML_Parser pXVar3;
  NAMED *pNVar4;
  BINDING *pBVar5;
  TAG *pTVar6;
  OPEN_INTERNAL_ENTITY *pOVar7;
  OPEN_INTERNAL_ENTITY *pOVar8;
  NAMED **ppNVar9;
  NAMED **ppNVar10;
  
  if (parser == (XML_Parser)0x0) {
    return;
  }
  pTVar6 = parser->m_tagStack;
  do {
    if (pTVar6 == (TAG *)0x0) {
      pTVar6 = parser->m_freeTagList;
      if (pTVar6 == (TAG *)0x0) {
        pOVar7 = parser->m_openInternalEntities;
        do {
          pOVar8 = pOVar7;
          if (pOVar7 == (OPEN_INTERNAL_ENTITY *)0x0) {
            pOVar8 = parser->m_freeInternalEntities;
            if (pOVar8 == (OPEN_INTERNAL_ENTITY *)0x0) {
              pBVar5 = parser->m_freeBindingList;
              while (pBVar5 != (BINDING *)0x0) {
                pbVar2 = pBVar5->nextTagBinding;
                (*(parser->m_mem).free_fcn)(pBVar5->uri);
                (*(parser->m_mem).free_fcn)(pBVar5);
                pBVar5 = pbVar2;
              }
              pBVar5 = parser->m_inheritedBindings;
              while (pBVar5 != (BINDING *)0x0) {
                pbVar2 = pBVar5->nextTagBinding;
                (*(parser->m_mem).free_fcn)(pBVar5->uri);
                (*(parser->m_mem).free_fcn)(pBVar5);
                pBVar5 = pbVar2;
              }
              poolDestroy(&parser->m_tempPool);
              poolDestroy(&parser->m_temp2Pool);
              (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
              table = parser->m_dtd;
              if (table != (DTD *)0x0) {
                ppNVar9 = (table->elementTypes).v;
                if (ppNVar9 == (NAMED **)0x0) {
                  ppNVar10 = (NAMED **)0x0;
                }
                else {
                  ppNVar10 = ppNVar9 + (table->elementTypes).size;
                }
                pXVar3 = parser->m_parentParser;
                while (ppNVar9 != ppNVar10) {
                  pNVar4 = *ppNVar9;
                  ppNVar9 = ppNVar9 + 1;
                  if ((pNVar4 != (NAMED *)0x0) && (*(int *)((long)&pNVar4[3].name + 4) != 0)) {
                    (*(parser->m_mem).free_fcn)(pNVar4[4].name);
                  }
                }
                hashTableDestroy(&table->generalEntities);
                hashTableDestroy(&table->elementTypes);
                hashTableDestroy(&table->attributeIds);
                hashTableDestroy(&table->prefixes);
                poolDestroy(&table->pool);
                poolDestroy(&table->entityValuePool);
                if (pXVar3 == (XML_Parser)0x0) {
                  (*(parser->m_mem).free_fcn)(table->scaffIndex);
                  (*(parser->m_mem).free_fcn)(table->scaffold);
                }
                (*(parser->m_mem).free_fcn)(table);
              }
              (*(parser->m_mem).free_fcn)(parser->m_atts);
              (*(parser->m_mem).free_fcn)(parser->m_groupConnector);
              (*(parser->m_mem).free_fcn)(parser->m_buffer);
              (*(parser->m_mem).free_fcn)(parser->m_dataBuf);
              (*(parser->m_mem).free_fcn)(parser->m_nsAtts);
              (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
              if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
                (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
              }
              (*(parser->m_mem).free_fcn)(parser);
              return;
            }
            parser->m_freeInternalEntities = (OPEN_INTERNAL_ENTITY *)0x0;
          }
          pOVar7 = pOVar8->next;
          (*(parser->m_mem).free_fcn)(pOVar8);
        } while( true );
      }
      parser->m_freeTagList = (TAG *)0x0;
    }
    ptVar1 = pTVar6->parent;
    (*(parser->m_mem).free_fcn)(pTVar6->buf);
    pBVar5 = pTVar6->bindings;
    while (pBVar5 != (BINDING *)0x0) {
      pbVar2 = pBVar5->nextTagBinding;
      (*(parser->m_mem).free_fcn)(pBVar5->uri);
      (*(parser->m_mem).free_fcn)(pBVar5);
      pBVar5 = pbVar2;
    }
    (*(parser->m_mem).free_fcn)(pTVar6);
    pTVar6 = ptVar1;
  } while( true );
}

Assistant:

void XMLCALL
XML_ParserFree(XML_Parser parser) {
  TAG *tagList;
  OPEN_INTERNAL_ENTITY *entityList;
  if (parser == NULL)
    return;
  /* free m_tagStack and m_freeTagList */
  tagList = parser->m_tagStack;
  for (;;) {
    TAG *p;
    if (tagList == NULL) {
      if (parser->m_freeTagList == NULL)
        break;
      tagList = parser->m_freeTagList;
      parser->m_freeTagList = NULL;
    }
    p = tagList;
    tagList = tagList->parent;
    FREE(parser, p->buf);
    destroyBindings(p->bindings, parser);
    FREE(parser, p);
  }
  /* free m_openInternalEntities and m_freeInternalEntities */
  entityList = parser->m_openInternalEntities;
  for (;;) {
    OPEN_INTERNAL_ENTITY *openEntity;
    if (entityList == NULL) {
      if (parser->m_freeInternalEntities == NULL)
        break;
      entityList = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = NULL;
    }
    openEntity = entityList;
    entityList = entityList->next;
    FREE(parser, openEntity);
  }

  destroyBindings(parser->m_freeBindingList, parser);
  destroyBindings(parser->m_inheritedBindings, parser);
  poolDestroy(&parser->m_tempPool);
  poolDestroy(&parser->m_temp2Pool);
  FREE(parser, (void *)parser->m_protocolEncodingName);
#ifdef XML_DTD
  /* external parameter entity parsers share the DTD structure
     parser->m_dtd with the root parser, so we must not destroy it
  */
  if (! parser->m_isParamEntity && parser->m_dtd)
#else
  if (parser->m_dtd)
#endif /* XML_DTD */
    dtdDestroy(parser->m_dtd, (XML_Bool)! parser->m_parentParser,
               &parser->m_mem);
  FREE(parser, (void *)parser->m_atts);
#ifdef XML_ATTR_INFO
  FREE(parser, (void *)parser->m_attInfo);
#endif
  FREE(parser, parser->m_groupConnector);
  FREE(parser, parser->m_buffer);
  FREE(parser, parser->m_dataBuf);
  FREE(parser, parser->m_nsAtts);
  FREE(parser, parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease)
    parser->m_unknownEncodingRelease(parser->m_unknownEncodingData);
  FREE(parser, parser);
}